

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

void __thiscall MeterPrivate::drawRanges(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  uint uVar1;
  QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
  *pQVar2;
  undefined1 auVar3 [16];
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  QBrush local_78 [8];
  QMarginsF local_70;
  QRectF r;
  
  uVar1 = this->startScaleAngle;
  params->scaleDegree = (double)(this->stopScaleAngle - uVar1);
  params->startScaleAngle = (double)uVar1;
  auVar8._0_8_ = (double)this->radius;
  params->scaleWidth = auVar8._0_8_ / 30.0;
  auVar8._8_8_ = auVar8._0_8_;
  auVar6 = divpd(auVar8,_DAT_0010e0f0);
  params->margin = (qreal)auVar6._0_8_;
  params->gridLabelSize = (qreal)auVar6._8_8_;
  local_70.m_left = (auVar8._0_8_ / 30.0) * 0.5 + auVar6._0_8_;
  params->fontPixelSize = auVar6._8_8_ * 0.75;
  local_70.m_top = local_70.m_left;
  local_70.m_right = local_70.m_left;
  local_70.m_bottom = local_70.m_left;
  operator-(&params->rect,&local_70);
  QPainter::save();
  pQVar2 = (this->ranges).d.d;
  if (pQVar2 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = (pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var5 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var5 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var4 != p_Var5; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    QBrush::QBrush(local_78,&p_Var4[1]._M_right,1);
    QPen::QPen((QPen *)params->scaleWidth,&local_70,local_78,1,0x10,0x40);
    QPainter::setPen((QPen *)painter);
    QPen::~QPen((QPen *)&local_70);
    QBrush::~QBrush(local_78);
    dVar7 = this->maxValue - this->minValue;
    auVar6._0_8_ = p_Var4[1]._M_parent;
    auVar6._8_8_ = p_Var4[1]._M_left;
    auVar3._8_8_ = dVar7;
    auVar3._0_8_ = dVar7;
    auVar8 = divpd(auVar6,auVar3);
    QPainter::drawArc((QRectF *)painter,(int)&r,
                      (int)((-90.0 - (params->startScaleAngle + params->scaleDegree * auVar8._0_8_))
                           * 16.0));
  }
  QPainter::restore();
  return;
}

Assistant:

void
MeterPrivate::drawRanges( QPainter & painter, DrawParams & params )
{
	params.scaleDegree = stopScaleAngle - startScaleAngle;
	params.startScaleAngle = startScaleAngle;
	params.margin = radius / 20.0;

	const qreal gridLabelSizeFactor = 10.0;

	params.scaleWidth = radius / ( gridLabelSizeFactor + 20.0 );
	params.gridLabelSize = radius / gridLabelSizeFactor;
	params.fontPixelSize = params.gridLabelSize * 0.75;

	const qreal m = params.margin + params.scaleWidth / 2.0;

	const QRectF r = params.rect - QMarginsF( m, m, m,m );

	painter.save();

	for( auto it = ranges.cbegin(), last = ranges.cend(); it != last; ++it )
	{
		painter.setPen( QPen( it.value().color, params.scaleWidth ) );
		const qreal angle = params.startScaleAngle +
			params.scaleDegree * ( it.value().start / ( maxValue - minValue ) );
		const qreal span = params.startScaleAngle +
			params.scaleDegree * ( it.value().stop / ( maxValue - minValue ) ) - angle;
		painter.drawArc( r, ( -90.0 - angle ) * 16, -span * 16 );
	}

	painter.restore();
}